

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsRectVisible(ImVec2 *rect_min,ImVec2 *rect_max)

{
  bool bVar1;
  ImRect *this;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  ImGuiWindow *window;
  ImRect local_28;
  ImGuiWindow *local_18;
  
  local_18 = GImGui->CurrentWindow;
  this = &local_18->ClipRect;
  ImRect::ImRect(&local_28,in_RDI,in_RSI);
  bVar1 = ImRect::Overlaps(this,&local_28);
  return bVar1;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& rect_min, const ImVec2& rect_max)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(rect_min, rect_max));
}